

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qkmsdevice.cpp
# Opt level: O3

void __thiscall QKmsDevice::createScreens(QKmsDevice *this)

{
  bool bVar1;
  VirtualDesktopLayout VVar2;
  char16_t *pcVar3;
  undefined8 uVar4;
  int *piVar5;
  QPoint QVar6;
  QDebug QVar7;
  Data *this_00;
  char cVar8;
  int iVar9;
  uint uVar10;
  undefined4 extraout_var;
  drmModeResPtr resources;
  drmModeConnectorPtr connector;
  QPlatformScreen *pQVar11;
  iterator iVar12;
  iterator iVar13;
  long lVar14;
  iterator iVar15;
  iterator iVar16;
  pointer ppQVar17;
  pointer pQVar18;
  QPoint *pQVar19;
  undefined8 *puVar20;
  char *pcVar21;
  ulong uVar22;
  OrderedScreen *orderedScreen;
  uint uVar23;
  OrderedScreen *s;
  long in_FS_OFFSET;
  undefined1 auVar24 [16];
  QByteArrayView QVar25;
  QStringView QVar26;
  QStringView QVar27;
  QByteArrayView QVar28;
  QByteArrayView QVar29;
  QByteArrayView QVar30;
  QByteArrayView QVar31;
  QByteArrayView QVar32;
  QByteArrayView QVar33;
  QByteArrayView QVar34;
  QByteArrayView QVar35;
  QStringView QVar36;
  QStringView QVar37;
  bool ok;
  ulong local_330;
  ulong local_320;
  QPoint local_310;
  undefined1 local_308 [8];
  undefined1 local_300 [16];
  QPoint local_2f0;
  undefined8 *local_2e8;
  QDebug local_2d8;
  undefined1 local_2d0 [8];
  QDebug local_2c8;
  QPoint local_2c0;
  QDebug local_2b8;
  QtPrivate local_2b0 [8];
  QList<QPoint> local_2a8;
  QList<QPlatformScreen_*> local_288;
  QDebug local_268;
  QtPrivate local_260 [8];
  OrderedScreen local_258;
  ScreenInfo local_158;
  bool local_59;
  QArrayDataPointer<OrderedScreen> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->m_screenConfig->m_headless == true) {
    iVar9 = (*this->_vptr_QKmsDevice[6])(this);
    if (CONCAT44(extraout_var,iVar9) != 0) {
      qLcKmsDebug();
      if (((byte)qLcKmsDebug::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) != 0) {
        local_258.screen._0_4_ = 2;
        local_258.screen._4_4_ = 0;
        local_258.vinfo.virtualIndex = 0;
        local_258.vinfo.virtualPos.xp.m_i = 0;
        local_258.vinfo.virtualPos.yp.m_i = 0;
        local_258.vinfo.isPrimary = false;
        local_258.vinfo._13_3_ = 0;
        local_258.vinfo.output.name.d.d = (Data *)qLcKmsDebug::category.name;
        QMessageLogger::debug((char *)&local_258,"Headless mode enabled");
      }
      local_158._0_5_ = 0;
      local_158.virtualPos.xp.m_i._1_3_ = 0;
      local_258.vinfo.virtualPos.yp.m_i = 0;
      local_258.vinfo.isPrimary = false;
      local_258.vinfo._13_3_ = 0;
      local_258.screen._0_4_ = 0;
      local_258.screen._4_4_ = 0;
      local_258.vinfo.virtualIndex = 0;
      local_258.vinfo.virtualPos.xp.m_i = 0;
      (*this->_vptr_QKmsDevice[8])(this,CONCAT44(extraout_var,iVar9),1,&local_158,&local_258);
      auVar24._8_8_ = local_300._8_8_;
      auVar24._0_8_ = local_300._0_8_;
      piVar5 = (int *)CONCAT44(local_258.screen._4_4_,local_258.screen._0_4_);
      if (piVar5 != (int *)0x0) {
        LOCK();
        *piVar5 = *piVar5 + -1;
        UNLOCK();
        local_300 = auVar24;
        if (*piVar5 == 0) {
          QArrayData::deallocate
                    ((QArrayData *)CONCAT44(local_258.screen._4_4_,local_258.screen._0_4_),8,0x10);
        }
      }
      goto LAB_0013611b;
    }
    createScreens();
  }
  drmSetClientCap(this->m_dri_fd,2,1);
  iVar9 = drmSetClientCap(this->m_dri_fd,3,1);
  this->m_has_atomic_support = iVar9 == 0;
  if (iVar9 == 0) {
    qLcKmsDebug();
    if (((byte)qLcKmsDebug::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) != 0) {
      local_258.screen._0_4_ = 2;
      local_258.screen._4_4_ = 0;
      local_258.vinfo.virtualIndex = 0;
      local_258.vinfo.virtualPos.xp.m_i = 0;
      local_258.vinfo.virtualPos.yp.m_i = 0;
      local_258.vinfo.isPrimary = false;
      local_258.vinfo._13_3_ = 0;
      local_258.vinfo.output.name.d.d = (Data *)qLcKmsDebug::category.name;
      QMessageLogger::debug((char *)&local_258);
    }
    iVar9 = qEnvironmentVariableIntValue("QT_QPA_EGLFS_KMS_ATOMIC",(bool *)0x0);
    qLcKmsDebug();
    if (iVar9 == 0) {
      if (((byte)qLcKmsDebug::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) != 0) {
        local_258.screen._0_4_ = 2;
        local_258.screen._4_4_ = 0;
        local_258.vinfo.virtualIndex = 0;
        local_258.vinfo.virtualPos.xp.m_i = 0;
        local_258.vinfo.virtualPos.yp.m_i = 0;
        local_258.vinfo.isPrimary = false;
        local_258.vinfo._13_3_ = 0;
        local_258.vinfo.output.name.d.d = (Data *)qLcKmsDebug::category.name;
        QMessageLogger::debug((char *)&local_258,"Atomic disabled");
      }
      this->m_has_atomic_support = false;
    }
    else if (((byte)qLcKmsDebug::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) != 0
            ) {
      local_258.screen._0_4_ = 2;
      local_258.screen._4_4_ = 0;
      local_258.vinfo.virtualIndex = 0;
      local_258.vinfo.virtualPos.xp.m_i = 0;
      local_258.vinfo.virtualPos.yp.m_i = 0;
      local_258.vinfo.isPrimary = false;
      local_258.vinfo._13_3_ = 0;
      local_258.vinfo.output.name.d.d = (Data *)qLcKmsDebug::category.name;
      QMessageLogger::debug((char *)&local_258,"Atomic enabled");
    }
  }
  resources = (drmModeResPtr)drmModeGetResources(this->m_dri_fd);
  if (resources == (drmModeResPtr)0x0) {
    createScreens();
  }
  else {
    discoverPlanes(this);
    local_58.d = (Data *)0x0;
    local_58.ptr = (OrderedScreen *)0x0;
    local_58.size = 0;
    local_59 = true;
    uVar10 = qEnvironmentVariableIntValue("QT_QPA_EGLFS_KMS_CONNECTOR_INDEX",&local_59);
    uVar23 = 0xffffffff;
    if ((local_59 == true) &&
       (((int)uVar10 < 0 || (uVar23 = uVar10, resources->count_connectors <= (int)uVar10)))) {
      local_258.screen._0_4_ = 2;
      local_258.screen._4_4_ = 0;
      local_258.vinfo.virtualIndex = 0;
      local_258.vinfo.virtualPos.xp.m_i = 0;
      local_258.vinfo.virtualPos.yp.m_i = 0;
      local_258.vinfo.isPrimary = false;
      local_258.vinfo._13_3_ = 0;
      local_258.vinfo.output.name.d.d = (Data *)0x1431a9;
      QMessageLogger::warning
                ((char *)&local_258,"Invalid connector index %d, must be between 0 and %u",
                 (ulong)uVar10,(ulong)(resources->count_connectors - 1));
      uVar23 = 0xffffffff;
    }
    if (0 < resources->count_connectors) {
      uVar22 = 0;
      do {
        if (((int)uVar23 < 0 || uVar23 == uVar22) &&
           (connector = (drmModeConnectorPtr)drmModeGetConnector(this->m_dri_fd),
           connector != (drmModeConnectorPtr)0x0)) {
          memcpy(&local_158,&DAT_00148460,0xa8);
          local_158.output.name.d.d = (Data *)0x0;
          local_158.output.name.d.ptr = (char16_t *)0x0;
          local_158.output.name.d.size = 0;
          local_158.output.connector_id = 0;
          local_158.output.crtc_index = 0;
          local_158.output.crtc_id = 0;
          local_158._0_5_ = 0;
          local_158.virtualPos.xp.m_i._1_3_ = 0;
          local_158.virtualPos.yp.m_i = 0;
          local_158.isPrimary = false;
          local_158.output.physical_size.wd = -1.0;
          local_158.output.physical_size.ht = -1.0;
          local_158.output.preferred_mode = -1;
          local_158.output.mode = -1;
          local_158.output.mode_set = false;
          local_158.output.modes.d.ptr = (_drmModeModeInfo *)0x0;
          local_158.output.modes.d.size = 0;
          local_158.output.saved_crtc = (drmModeCrtcPtr)0x0;
          local_158.output.modes.d.d = (Data *)0x0;
          local_158.output.subpixel = 1;
          local_158.output.forced_plane_id = 0;
          local_158.output.forced_plane_set = false;
          local_158.output.wants_forced_plane = false;
          local_158.output.dpms_prop = (drmModePropertyPtr)0x0;
          local_158.output.edid_blob = (drmModePropertyBlobPtr)0x0;
          local_158.output.drm_format = 0x34325258;
          local_158.output.drm_format_requested_by_user = false;
          local_158.output.clone_source.d.d = (Data *)0x0;
          local_158.output.clone_source.d.ptr = (char16_t *)0x0;
          local_158.output.clone_source.d.size = 0;
          local_158.output.available_planes.d.d = (Data *)0x0;
          local_158.output.available_planes.d.ptr = (QKmsPlane *)0x0;
          local_158.output.available_planes.d.size = 0;
          local_158.output.eglfs_plane = (QKmsPlane *)0x0;
          local_158.output.size.wd.m_i = -1;
          local_158.output.size.ht.m_i = -1;
          local_158.output.crtcIdPropertyId = 0;
          local_158.output.modeIdPropertyId = 0;
          local_158.output.activePropertyId = 0;
          local_158.output.mode_blob_id = 0;
          pQVar11 = createScreenForConnector(this,resources,connector,&local_158);
          if (pQVar11 != (QPlatformScreen *)0x0) {
            local_258.screen._0_4_ = SUB84(pQVar11,0);
            local_258.screen._4_4_ = (undefined4)((ulong)pQVar11 >> 0x20);
            local_258.vinfo.virtualPos.yp.m_i = local_158.virtualPos.yp.m_i;
            local_258.vinfo.isPrimary = local_158.isPrimary;
            local_258.vinfo.virtualIndex = local_158.virtualIndex;
            local_258.vinfo.virtualPos.xp.m_i =
                 (int)(CONCAT35(local_158.virtualPos.xp.m_i._1_3_,local_158._0_5_) >> 0x20);
            local_258.vinfo.output.name.d.d = local_158.output.name.d.d;
            local_258.vinfo.output.name.d.ptr = local_158.output.name.d.ptr;
            local_258.vinfo.output.name.d.size = local_158.output.name.d.size;
            if (&(local_158.output.name.d.d)->super_QArrayData != (QArrayData *)0x0) {
              LOCK();
              ((local_158.output.name.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>
              ._M_i = ((local_158.output.name.d.d)->super_QArrayData).ref_._q_value.
                      super___atomic_base<int>._M_i + 1;
              UNLOCK();
            }
            local_258.vinfo.output.saved_crtc = local_158.output.saved_crtc;
            local_258.vinfo.output._36_4_ = local_158.output._36_4_;
            local_258.vinfo.output.crtc_id = local_158.output.crtc_id;
            local_258.vinfo.output._65_7_ = local_158.output._65_7_;
            local_258.vinfo.output.mode_set = local_158.output.mode_set;
            local_258.vinfo.output.preferred_mode = local_158.output.preferred_mode;
            local_258.vinfo.output.mode = local_158.output.mode;
            local_258.vinfo.output.physical_size.wd = local_158.output.physical_size.wd;
            local_258.vinfo.output.physical_size.ht = local_158.output.physical_size.ht;
            local_258.vinfo.output.connector_id = local_158.output.connector_id;
            local_258.vinfo.output.crtc_index = local_158.output.crtc_index;
            local_258.vinfo.output.modes.d.d = local_158.output.modes.d.d;
            local_258.vinfo.output.modes.d.ptr = local_158.output.modes.d.ptr;
            local_258.vinfo.output.modes.d.size = local_158.output.modes.d.size;
            if (&(local_158.output.modes.d.d)->super_QArrayData != (QArrayData *)0x0) {
              LOCK();
              ((local_158.output.modes.d.d)->super_QArrayData).ref_._q_value.
              super___atomic_base<int>._M_i =
                   ((local_158.output.modes.d.d)->super_QArrayData).ref_._q_value.
                   super___atomic_base<int>._M_i + 1;
              UNLOCK();
            }
            local_258.vinfo.output._108_4_ = local_158.output._108_4_;
            local_258.vinfo.output.subpixel = local_158.output.subpixel;
            local_258.vinfo.output.drm_format = local_158.output.drm_format;
            local_258.vinfo.output._137_3_ = local_158.output._137_3_;
            local_258.vinfo.output.drm_format_requested_by_user =
                 local_158.output.drm_format_requested_by_user;
            local_258.vinfo.output.forced_plane_set = local_158.output.forced_plane_set;
            local_258.vinfo.output.edid_blob = local_158.output.edid_blob;
            local_258.vinfo.output.wants_forced_plane = local_158.output.wants_forced_plane;
            local_258.vinfo.output._129_7_ =
                 SUB87(CONCAT44(local_158.output.forced_plane_id,local_158.output._128_4_) >> 8,0);
            local_258.vinfo.output.dpms_prop = local_158.output.dpms_prop;
            local_258.vinfo.output.clone_source.d.d = local_158.output.clone_source.d.d;
            local_258.vinfo.output.clone_source.d.ptr = local_158.output.clone_source.d.ptr;
            local_258.vinfo.output.clone_source.d.size = local_158.output.clone_source.d.size;
            if (&(local_158.output.clone_source.d.d)->super_QArrayData != (QArrayData *)0x0) {
              LOCK();
              ((local_158.output.clone_source.d.d)->super_QArrayData).ref_._q_value.
              super___atomic_base<int>._M_i =
                   ((local_158.output.clone_source.d.d)->super_QArrayData).ref_._q_value.
                   super___atomic_base<int>._M_i + 1;
              UNLOCK();
            }
            local_258.vinfo.output.available_planes.d.d = local_158.output.available_planes.d.d;
            local_258.vinfo.output.available_planes.d.ptr = local_158.output.available_planes.d.ptr;
            local_258.vinfo.output.available_planes.d.size =
                 local_158.output.available_planes.d.size;
            if (local_158.output.available_planes.d.d != (Data *)0x0) {
              LOCK();
              ((local_158.output.available_planes.d.d)->super_QArrayData).ref_._q_value.
              super___atomic_base<int>._M_i =
                   ((local_158.output.available_planes.d.d)->super_QArrayData).ref_._q_value.
                   super___atomic_base<int>._M_i + 1;
              UNLOCK();
            }
            local_258.vinfo.output.crtcIdPropertyId = local_158.output.crtcIdPropertyId;
            local_258.vinfo.output.modeIdPropertyId = local_158.output.modeIdPropertyId;
            local_258.vinfo.output.activePropertyId = local_158.output.activePropertyId;
            local_258.vinfo.output.mode_blob_id = local_158.output.mode_blob_id;
            local_258.vinfo.output.eglfs_plane = local_158.output.eglfs_plane;
            local_258.vinfo.output.size = local_158.output.size;
            QtPrivate::QGenericArrayOps<OrderedScreen>::emplace<OrderedScreen>
                      ((QGenericArrayOps<OrderedScreen> *)&local_58,local_58.size,&local_258);
            QList<OrderedScreen>::end((QList<OrderedScreen> *)&local_58);
            QArrayDataPointer<QKmsPlane>::~QArrayDataPointer
                      (&local_258.vinfo.output.available_planes.d);
            if (&(local_258.vinfo.output.clone_source.d.d)->super_QArrayData != (QArrayData *)0x0) {
              LOCK();
              ((local_258.vinfo.output.clone_source.d.d)->super_QArrayData).ref_._q_value.
              super___atomic_base<int>._M_i =
                   ((local_258.vinfo.output.clone_source.d.d)->super_QArrayData).ref_._q_value.
                   super___atomic_base<int>._M_i + -1;
              UNLOCK();
              if (((local_258.vinfo.output.clone_source.d.d)->super_QArrayData).ref_._q_value.
                  super___atomic_base<int>._M_i == 0) {
                QArrayData::deallocate
                          (&(local_258.vinfo.output.clone_source.d.d)->super_QArrayData,2,0x10);
              }
            }
            if (&(local_258.vinfo.output.modes.d.d)->super_QArrayData != (QArrayData *)0x0) {
              LOCK();
              ((local_258.vinfo.output.modes.d.d)->super_QArrayData).ref_._q_value.
              super___atomic_base<int>._M_i =
                   ((local_258.vinfo.output.modes.d.d)->super_QArrayData).ref_._q_value.
                   super___atomic_base<int>._M_i + -1;
              UNLOCK();
              if (((local_258.vinfo.output.modes.d.d)->super_QArrayData).ref_._q_value.
                  super___atomic_base<int>._M_i == 0) {
                QArrayData::deallocate
                          (&(local_258.vinfo.output.modes.d.d)->super_QArrayData,0x44,0x10);
              }
            }
            if (&(local_258.vinfo.output.name.d.d)->super_QArrayData != (QArrayData *)0x0) {
              LOCK();
              ((local_258.vinfo.output.name.d.d)->super_QArrayData).ref_._q_value.
              super___atomic_base<int>._M_i =
                   ((local_258.vinfo.output.name.d.d)->super_QArrayData).ref_._q_value.
                   super___atomic_base<int>._M_i + -1;
              UNLOCK();
              if (((local_258.vinfo.output.name.d.d)->super_QArrayData).ref_._q_value.
                  super___atomic_base<int>._M_i == 0) {
                QArrayData::deallocate(&(local_258.vinfo.output.name.d.d)->super_QArrayData,2,0x10);
              }
            }
          }
          drmModeFreeConnector(connector);
          QArrayDataPointer<QKmsPlane>::~QArrayDataPointer(&local_158.output.available_planes.d);
          if (&(local_158.output.clone_source.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_158.output.clone_source.d.d)->super_QArrayData).ref_._q_value.
            super___atomic_base<int>._M_i =
                 ((local_158.output.clone_source.d.d)->super_QArrayData).ref_._q_value.
                 super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if (((local_158.output.clone_source.d.d)->super_QArrayData).ref_._q_value.
                super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(&(local_158.output.clone_source.d.d)->super_QArrayData,2,0x10);
            }
          }
          if (&(local_158.output.modes.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_158.output.modes.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
            _M_i = ((local_158.output.modes.d.d)->super_QArrayData).ref_._q_value.
                   super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if (((local_158.output.modes.d.d)->super_QArrayData).ref_._q_value.
                super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(&(local_158.output.modes.d.d)->super_QArrayData,0x44,0x10);
            }
          }
          if (&(local_158.output.name.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_158.output.name.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
            _M_i = ((local_158.output.name.d.d)->super_QArrayData).ref_._q_value.
                   super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if (((local_158.output.name.d.d)->super_QArrayData).ref_._q_value.
                super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(&(local_158.output.name.d.d)->super_QArrayData,2,0x10);
            }
          }
        }
        uVar22 = uVar22 + 1;
      } while ((long)uVar22 < (long)resources->count_connectors);
    }
    drmModeFreeResources(resources);
    iVar12 = QList<OrderedScreen>::begin((QList<OrderedScreen> *)&local_58);
    iVar13 = QList<OrderedScreen>::end((QList<OrderedScreen> *)&local_58);
    if (iVar12.i != iVar13.i) {
      lVar14 = (long)iVar13.i - (long)iVar12.i >> 8;
      local_258.vinfo.virtualPos.yp.m_i = -0x55555556;
      local_258.vinfo.isPrimary = true;
      local_258.vinfo._13_3_ = 0xaaaaaa;
      local_258.screen._0_4_ = 0xaaaaaaaa;
      local_258.screen._4_4_ = 0xaaaaaaaa;
      local_258.vinfo.virtualIndex = -0x55555556;
      local_258.vinfo.virtualPos.xp.m_i = -0x55555556;
      std::_Temporary_buffer<QList<OrderedScreen>::iterator,_OrderedScreen>::_Temporary_buffer
                ((_Temporary_buffer<QList<OrderedScreen>::iterator,_OrderedScreen> *)&local_258,
                 iVar12,(lVar14 - (lVar14 + 1 >> 0x3f)) + 1 >> 1);
      if ((OrderedScreen *)CONCAT44(local_258.vinfo._12_4_,local_258.vinfo.virtualPos.yp.m_i) ==
          (OrderedScreen *)0x0) {
        std::
        __inplace_stable_sort<QList<OrderedScreen>::iterator,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(OrderedScreen_const&,OrderedScreen_const&)>>
                  (iVar12,iVar13,
                   (_Iter_comp_iter<bool_(*)(const_OrderedScreen_&,_const_OrderedScreen_&)>)0x13668a
                  );
      }
      else {
        std::
        __stable_sort_adaptive<QList<OrderedScreen>::iterator,OrderedScreen*,long_long,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(OrderedScreen_const&,OrderedScreen_const&)>>
                  (iVar12,iVar13,
                   (OrderedScreen *)
                   CONCAT44(local_258.vinfo._12_4_,local_258.vinfo.virtualPos.yp.m_i),
                   CONCAT44(local_258.vinfo.virtualPos.xp.m_i,local_258.vinfo.virtualIndex),
                   (_Iter_comp_iter<bool_(*)(const_OrderedScreen_&,_const_OrderedScreen_&)>)0x13668a
                  );
      }
      std::_Destroy_aux<false>::__destroy<OrderedScreen*>
                ((OrderedScreen *)CONCAT44(local_258.vinfo._12_4_,local_258.vinfo.virtualPos.yp.m_i)
                 ,(OrderedScreen *)
                  CONCAT44(local_258.vinfo._12_4_,local_258.vinfo.virtualPos.yp.m_i) +
                  CONCAT44(local_258.vinfo.virtualPos.xp.m_i,local_258.vinfo.virtualIndex));
      operator_delete((void *)CONCAT44(local_258.vinfo._12_4_,local_258.vinfo.virtualPos.yp.m_i),
                      CONCAT44(local_258.vinfo.virtualPos.xp.m_i,local_258.vinfo.virtualIndex) << 8)
      ;
    }
    qLcKmsDebug();
    if (((byte)qLcKmsDebug::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) != 0) {
      local_258.screen._0_4_ = 2;
      local_258.screen._4_4_ = 0;
      local_258.vinfo.virtualIndex = 0;
      local_258.vinfo.virtualPos.xp.m_i = 0;
      local_258.vinfo.virtualPos.yp.m_i = 0;
      local_258.vinfo.isPrimary = false;
      local_258.vinfo._13_3_ = 0;
      local_258.vinfo.output.name.d.d = (Data *)qLcKmsDebug::category.name;
      QMessageLogger::debug();
      this_00 = local_288.d.d;
      QVar25.m_data = (storage_type *)0x13;
      QVar25.m_size = (qsizetype)&local_158;
      QString::fromUtf8(QVar25);
      QTextStream::operator<<((QTextStream *)this_00,(QString *)&local_158);
      piVar5 = (int *)CONCAT35(local_158.virtualPos.xp.m_i._1_3_,local_158._0_5_);
      if (piVar5 != (int *)0x0) {
        LOCK();
        *piVar5 = *piVar5 + -1;
        UNLOCK();
        if (*piVar5 == 0) {
          QArrayData::deallocate
                    ((QArrayData *)CONCAT35(local_158.virtualPos.xp.m_i._1_3_,local_158._0_5_),2,
                     0x10);
        }
      }
      if ((char)local_288.d.d[3].super_QArrayData.ref_._q_value.super___atomic_base<int>._M_i ==
          '\x01') {
        QTextStream::operator<<((QTextStream *)local_288.d.d,' ');
      }
      *(int *)&(&(local_288.d.d)->super_QArrayData)[2].alloc =
           (int)(&(local_288.d.d)->super_QArrayData)[2].alloc + 1;
      local_268.stream = (Stream *)0x0;
      local_158._0_5_ = SUB85(local_288.d.d,0);
      local_158.virtualPos.xp.m_i._1_3_ = (undefined3)((ulong)local_288.d.d >> 0x28);
      QtPrivate::printSequentialContainer<QList<OrderedScreen>>
                (local_260,(Stream *)&local_158,"QList",(QList<OrderedScreen> *)&local_58);
      QDebug::~QDebug((QDebug *)&local_158);
      QDebug::~QDebug((QDebug *)local_260);
      QDebug::~QDebug(&local_268);
      QDebug::~QDebug((QDebug *)&local_288);
    }
    iVar12 = QList<OrderedScreen>::begin((QList<OrderedScreen> *)&local_58);
    iVar13 = QList<OrderedScreen>::end((QList<OrderedScreen> *)&local_58);
    if (iVar12.i != iVar13.i) {
      do {
        local_288.d.d = (Data *)0x0;
        local_288.d.ptr = (QPlatformScreen **)0x0;
        local_288.d.size = 0;
        iVar15 = QList<OrderedScreen>::begin((QList<OrderedScreen> *)&local_58);
        iVar16 = QList<OrderedScreen>::end((QList<OrderedScreen> *)&local_58);
        for (; iVar15.i != iVar16.i; iVar15.i = iVar15.i + 1) {
          lVar14 = ((iVar15.i)->vinfo).output.clone_source.d.size;
          if ((lVar14 == ((iVar12.i)->vinfo).output.name.d.size) &&
             (QVar26.m_data = ((iVar15.i)->vinfo).output.clone_source.d.ptr, QVar26.m_size = lVar14,
             QVar36.m_data = ((iVar12.i)->vinfo).output.name.d.ptr, QVar36.m_size = lVar14,
             cVar8 = QtPrivate::equalStrings(QVar26,QVar36), cVar8 != '\0')) {
            local_258.screen._0_4_ = SUB84((iVar15.i)->screen,0);
            local_258.screen._4_4_ = (undefined4)((ulong)(iVar15.i)->screen >> 0x20);
            QtPrivate::QPodArrayOps<QPlatformScreen*>::emplace<QPlatformScreen*&>
                      ((QPodArrayOps<QPlatformScreen*> *)&local_288,local_288.d.size,
                       &local_258.screen);
            QList<QPlatformScreen_*>::end(&local_288);
          }
        }
        if (((iVar12.i)->vinfo).output.clone_source.d.size == 0) {
LAB_0013563a:
          pQVar11 = (QPlatformScreen *)0x0;
        }
        else {
          iVar15 = QList<OrderedScreen>::begin((QList<OrderedScreen> *)&local_58);
          iVar16 = QList<OrderedScreen>::end((QList<OrderedScreen> *)&local_58);
          if (iVar15.i == iVar16.i) goto LAB_0013563a;
          pcVar3 = ((iVar12.i)->vinfo).output.clone_source.d.ptr;
          lVar14 = ((iVar12.i)->vinfo).output.clone_source.d.size;
          do {
            if ((((iVar15.i)->vinfo).output.name.d.size == lVar14) &&
               (QVar27.m_data = ((iVar15.i)->vinfo).output.name.d.ptr, QVar27.m_size = lVar14,
               QVar37.m_data = pcVar3, QVar37.m_size = lVar14,
               cVar8 = QtPrivate::equalStrings(QVar27,QVar37), cVar8 != '\0')) {
              pQVar11 = (iVar15.i)->screen;
              if (pQVar11 != (QPlatformScreen *)0x0) {
                qLcKmsDebug();
                if (((byte)qLcKmsDebug::category.field_2.bools.enabledDebug._q_value._M_base._M_i &
                    1) != 0) {
                  local_258.screen._0_4_ = 2;
                  local_258.screen._4_4_ = 0;
                  local_258.vinfo.virtualIndex = 0;
                  local_258.vinfo.virtualPos.xp.m_i = 0;
                  local_258.vinfo.virtualPos.yp.m_i = 0;
                  local_258.vinfo.isPrimary = false;
                  local_258.vinfo._13_3_ = 0;
                  local_258.vinfo.output.name.d.d = (Data *)qLcKmsDebug::category.name;
                  QMessageLogger::debug();
                  (**(code **)(*(long *)(iVar12.i)->screen + 0x90))(&local_2a8);
                  pQVar19 = local_2a8.d.ptr;
                  if (local_2a8.d.ptr == (QPoint *)0x0) {
                    pQVar19 = (QPoint *)&QString::_empty;
                  }
                  QDebug::putString((QChar *)&local_2f0,(ulong)pQVar19);
                  if ((char)(((QArrayData *)((long)local_2f0 + 0x30))->ref_)._q_value.
                            super___atomic_base<int>._M_i == '\x01') {
                    QTextStream::operator<<((QTextStream *)local_2f0,' ');
                  }
                  QVar6 = local_2f0;
                  QVar29.m_data = (storage_type *)0x6;
                  QVar29.m_size = (qsizetype)&local_158;
                  QString::fromUtf8(QVar29);
                  QTextStream::operator<<((QTextStream *)QVar6,(QString *)&local_158);
                  piVar5 = (int *)CONCAT35(local_158.virtualPos.xp.m_i._1_3_,local_158._0_5_);
                  if (piVar5 != (int *)0x0) {
                    LOCK();
                    *piVar5 = *piVar5 + -1;
                    UNLOCK();
                    if (*piVar5 == 0) {
                      QArrayData::deallocate
                                ((QArrayData *)
                                 CONCAT35(local_158.virtualPos.xp.m_i._1_3_,local_158._0_5_),2,0x10)
                      ;
                    }
                  }
                  if ((char)(((QArrayData *)((long)local_2f0 + 0x30))->ref_)._q_value.
                            super___atomic_base<int>._M_i == '\x01') {
                    QTextStream::operator<<((QTextStream *)local_2f0,' ');
                  }
                  QTextStream::operator<<((QTextStream *)local_2f0,pQVar11);
                  if ((char)(((QArrayData *)((long)local_2f0 + 0x30))->ref_)._q_value.
                            super___atomic_base<int>._M_i == '\x01') {
                    QTextStream::operator<<((QTextStream *)local_2f0,' ');
                  }
                  if (&(local_2a8.d.d)->super_QArrayData != (QArrayData *)0x0) {
                    LOCK();
                    ((local_2a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                         = ((local_2a8.d.d)->super_QArrayData).ref_._q_value.
                           super___atomic_base<int>._M_i + -1;
                    UNLOCK();
                    if (((local_2a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                        _M_i == 0) {
                      QArrayData::deallocate(&(local_2a8.d.d)->super_QArrayData,2,0x10);
                    }
                  }
                  QDebug::~QDebug((QDebug *)&local_2f0);
                }
                goto LAB_0013563d;
              }
              break;
            }
            iVar15.i = iVar15.i + 1;
          } while (iVar15.i != iVar16.i);
          pQVar11 = (QPlatformScreen *)0x0;
        }
LAB_0013563d:
        if ((local_288.d.size != 0) &&
           (qLcKmsDebug(),
           ((byte)qLcKmsDebug::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) != 0))
        {
          local_258.screen._0_4_ = 2;
          local_258.screen._4_4_ = 0;
          local_258.vinfo.virtualIndex = 0;
          local_258.vinfo.virtualPos.xp.m_i = 0;
          local_258.vinfo.virtualPos.yp.m_i = 0;
          local_258.vinfo.isPrimary = false;
          local_258.vinfo._13_3_ = 0;
          local_258.vinfo.output.name.d.d = (Data *)qLcKmsDebug::category.name;
          QMessageLogger::debug();
          (**(code **)(*(long *)(iVar12.i)->screen + 0x90))(&local_2a8);
          pQVar19 = local_2a8.d.ptr;
          if (local_2a8.d.ptr == (QPoint *)0x0) {
            pQVar19 = (QPoint *)&QString::_empty;
          }
          QDebug::putString((QChar *)&local_2f0,(ulong)pQVar19);
          if ((char)(((QArrayData *)((long)local_2f0 + 0x30))->ref_)._q_value.
                    super___atomic_base<int>._M_i == '\x01') {
            QTextStream::operator<<((QTextStream *)local_2f0,' ');
          }
          QVar6 = local_2f0;
          QVar28.m_data = (storage_type *)0xc;
          QVar28.m_size = (qsizetype)&local_158;
          QString::fromUtf8(QVar28);
          QTextStream::operator<<((QTextStream *)QVar6,(QString *)&local_158);
          piVar5 = (int *)CONCAT35(local_158.virtualPos.xp.m_i._1_3_,local_158._0_5_);
          if (piVar5 != (int *)0x0) {
            LOCK();
            *piVar5 = *piVar5 + -1;
            UNLOCK();
            if (*piVar5 == 0) {
              QArrayData::deallocate
                        ((QArrayData *)CONCAT35(local_158.virtualPos.xp.m_i._1_3_,local_158._0_5_),2
                         ,0x10);
            }
          }
          if ((char)(((QArrayData *)((long)local_2f0 + 0x30))->ref_)._q_value.
                    super___atomic_base<int>._M_i == '\x01') {
            QTextStream::operator<<((QTextStream *)local_2f0,' ');
          }
          *(int *)((long)local_2f0 + 0x28) = *(int *)((long)local_2f0 + 0x28) + 1;
          local_2b8.stream = (Stream *)0x0;
          local_158._0_5_ = local_2f0._0_5_;
          local_158.virtualPos.xp.m_i._1_3_ = local_2f0.yp.m_i._1_3_;
          QtPrivate::printSequentialContainer<QList<QPlatformScreen*>>
                    (local_2b0,(Stream *)&local_158,"QList",&local_288);
          QDebug::~QDebug((QDebug *)&local_158);
          QDebug::~QDebug((QDebug *)local_2b0);
          QDebug::~QDebug(&local_2b8);
          if (&(local_2a8.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_2a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_2a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                 -1;
            UNLOCK();
            if (((local_2a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
               ) {
              QArrayData::deallocate(&(local_2a8.d.d)->super_QArrayData,2,0x10);
            }
          }
          QDebug::~QDebug((QDebug *)&local_2f0);
        }
        (*this->_vptr_QKmsDevice[7])
                  (this,(iVar12.i)->screen,pQVar11,(QPodArrayOps<QPlatformScreen*> *)&local_288);
        if (&(local_288.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_288.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_288.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_288.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
          {
            QArrayData::deallocate(&(local_288.d.d)->super_QArrayData,8,0x10);
          }
        }
        iVar12.i = iVar12.i + 1;
      } while (iVar12.i != iVar13.i);
    }
    local_288.d.d = (Data *)0x0;
    local_288.d.ptr = (QPlatformScreen **)0x0;
    local_288.d.size = 0;
    local_2a8.d.size = 0;
    local_2a8.d.d = (Data *)0x0;
    local_2a8.d.ptr = (QPoint *)0x0;
    iVar12 = QList<OrderedScreen>::begin((QList<OrderedScreen> *)&local_58);
    iVar13 = QList<OrderedScreen>::end((QList<OrderedScreen> *)&local_58);
    if (iVar12.i == iVar13.i) {
      local_320 = 0xffffffff;
    }
    else {
      uVar23 = 0;
      local_320 = 0xffffffff;
      local_330 = 0;
      do {
        pQVar11 = (iVar12.i)->screen;
        if (((iVar12.i)->vinfo).virtualPos.yp.m_i == 0 && ((iVar12.i)->vinfo).virtualPos.xp.m_i == 0
           ) {
          local_2c0 = (QPoint)(local_330 | (ulong)uVar23 << 0x20);
          VVar2 = this->m_screenConfig->m_virtualDesktopLayout;
          auVar24 = (**(code **)(*(long *)pQVar11 + 0x20))();
          if (VVar2 == VirtualDesktopLayoutVertical) {
            uVar23 = ((uVar23 + auVar24._12_4_) - auVar24._4_4_) + 1;
          }
          else {
            local_330 = (ulong)((((int)local_330 + auVar24._8_4_) - auVar24._0_4_) + 1);
          }
        }
        else {
          local_2c0 = ((iVar12.i)->vinfo).virtualPos;
        }
        qLcKmsDebug();
        if (((byte)qLcKmsDebug::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) != 0)
        {
          local_258.screen._0_4_ = 2;
          local_258.screen._4_4_ = 0;
          local_258.vinfo.virtualIndex = 0;
          local_258.vinfo.virtualPos.xp.m_i = 0;
          local_258.vinfo.virtualPos.yp.m_i = 0;
          local_258.vinfo.isPrimary = false;
          local_258.vinfo._13_3_ = 0;
          local_258.vinfo.output.name.d.d = (Data *)qLcKmsDebug::category.name;
          QMessageLogger::debug();
          QVar7.stream = local_2d8.stream;
          QVar30.m_data = (storage_type *)0x16;
          QVar30.m_size = (qsizetype)&local_158;
          QString::fromUtf8(QVar30);
          QTextStream::operator<<((QTextStream *)QVar7.stream,(QString *)&local_158);
          piVar5 = (int *)CONCAT35(local_158.virtualPos.xp.m_i._1_3_,local_158._0_5_);
          if (piVar5 != (int *)0x0) {
            LOCK();
            *piVar5 = *piVar5 + -1;
            UNLOCK();
            if (*piVar5 == 0) {
              QArrayData::deallocate
                        ((QArrayData *)CONCAT35(local_158.virtualPos.xp.m_i._1_3_,local_158._0_5_),2
                         ,0x10);
            }
          }
          if (*(QTextStream *)(local_2d8.stream + 0x30) == (QTextStream)0x1) {
            QTextStream::operator<<((QTextStream *)local_2d8.stream,' ');
          }
          QTextStream::operator<<((QTextStream *)local_2d8.stream,pQVar11);
          if (*(QTextStream *)(local_2d8.stream + 0x30) == (QTextStream)0x1) {
            QTextStream::operator<<((QTextStream *)local_2d8.stream,' ');
          }
          QVar7.stream = local_2d8.stream;
          QVar31.m_data = (storage_type *)0x1;
          QVar31.m_size = (qsizetype)&local_158;
          QString::fromUtf8(QVar31);
          QTextStream::operator<<((QTextStream *)QVar7.stream,(QString *)&local_158);
          piVar5 = (int *)CONCAT35(local_158.virtualPos.xp.m_i._1_3_,local_158._0_5_);
          if (piVar5 != (int *)0x0) {
            LOCK();
            *piVar5 = *piVar5 + -1;
            UNLOCK();
            if (*piVar5 == 0) {
              QArrayData::deallocate
                        ((QArrayData *)CONCAT35(local_158.virtualPos.xp.m_i._1_3_,local_158._0_5_),2
                         ,0x10);
            }
          }
          if (*(QTextStream *)(local_2d8.stream + 0x30) == (QTextStream)0x1) {
            QTextStream::operator<<((QTextStream *)local_2d8.stream,' ');
          }
          (**(code **)(*(long *)pQVar11 + 0x90))(&local_2f0,pQVar11);
          puVar20 = local_2e8;
          if (local_2e8 == (undefined8 *)0x0) {
            puVar20 = &QString::_empty;
          }
          QDebug::putString((QChar *)&local_2d8,(ulong)puVar20);
          if (*(QTextStream *)(local_2d8.stream + 0x30) == (QTextStream)0x1) {
            QTextStream::operator<<((QTextStream *)local_2d8.stream,' ');
          }
          QVar7.stream = local_2d8.stream;
          QVar32.m_data = (storage_type *)0x1;
          QVar32.m_size = (qsizetype)&local_158;
          QString::fromUtf8(QVar32);
          QTextStream::operator<<((QTextStream *)QVar7.stream,(QString *)&local_158);
          piVar5 = (int *)CONCAT35(local_158.virtualPos.xp.m_i._1_3_,local_158._0_5_);
          if (piVar5 != (int *)0x0) {
            LOCK();
            *piVar5 = *piVar5 + -1;
            UNLOCK();
            if (*piVar5 == 0) {
              QArrayData::deallocate
                        ((QArrayData *)CONCAT35(local_158.virtualPos.xp.m_i._1_3_,local_158._0_5_),2
                         ,0x10);
            }
          }
          if (*(QTextStream *)(local_2d8.stream + 0x30) == (QTextStream)0x1) {
            QTextStream::operator<<((QTextStream *)local_2d8.stream,' ');
          }
          QVar7.stream = local_2d8.stream;
          QVar33.m_data = (storage_type *)0x14;
          QVar33.m_size = (qsizetype)&local_158;
          QString::fromUtf8(QVar33);
          QTextStream::operator<<((QTextStream *)QVar7.stream,(QString *)&local_158);
          piVar5 = (int *)CONCAT35(local_158.virtualPos.xp.m_i._1_3_,local_158._0_5_);
          if (piVar5 != (int *)0x0) {
            LOCK();
            *piVar5 = *piVar5 + -1;
            UNLOCK();
            if (*piVar5 == 0) {
              QArrayData::deallocate
                        ((QArrayData *)CONCAT35(local_158.virtualPos.xp.m_i._1_3_,local_158._0_5_),2
                         ,0x10);
            }
          }
          if (*(QTextStream *)(local_2d8.stream + 0x30) == (QTextStream)0x1) {
            QTextStream::operator<<((QTextStream *)local_2d8.stream,' ');
          }
          local_2d0 = (undefined1  [8])local_2d8.stream;
          *(int *)(local_2d8.stream + 0x28) = *(int *)(local_2d8.stream + 0x28) + 1;
          auVar24 = (**(code **)(*(long *)pQVar11 + 0x20))(pQVar11);
          local_300 = auVar24;
          ::operator<<((Stream *)&local_2c8,(QRect *)local_2d0);
          QVar7.stream = local_2c8.stream;
          QVar34.m_data = (storage_type *)0xe;
          QVar34.m_size = (qsizetype)&local_158;
          QString::fromUtf8(QVar34);
          QTextStream::operator<<((QTextStream *)QVar7.stream,(QString *)&local_158);
          piVar5 = (int *)CONCAT35(local_158.virtualPos.xp.m_i._1_3_,local_158._0_5_);
          if (piVar5 != (int *)0x0) {
            LOCK();
            *piVar5 = *piVar5 + -1;
            UNLOCK();
            if (*piVar5 == 0) {
              QArrayData::deallocate
                        ((QArrayData *)CONCAT35(local_158.virtualPos.xp.m_i._1_3_,local_158._0_5_),2
                         ,0x10);
            }
          }
          if (*(QTextStream *)(local_2c8.stream + 0x30) == (QTextStream)0x1) {
            QTextStream::operator<<((QTextStream *)local_2c8.stream,' ');
          }
          pcVar21 = "false";
          if (((iVar12.i)->vinfo).isPrimary != false) {
            pcVar21 = "true";
          }
          QTextStream::operator<<((QTextStream *)local_2c8.stream,pcVar21);
          if (*(QTextStream *)(local_2c8.stream + 0x30) == (QTextStream)0x1) {
            QTextStream::operator<<((QTextStream *)local_2c8.stream,' ');
          }
          QDebug::~QDebug(&local_2c8);
          QDebug::~QDebug((QDebug *)local_2d0);
          if (local_2f0 != (QPoint)0x0) {
            LOCK();
            *(int *)local_2f0 = *(int *)local_2f0 + -1;
            UNLOCK();
            if (*(int *)local_2f0 == 0) {
              QArrayData::deallocate((QArrayData *)local_2f0,2,0x10);
            }
          }
          QDebug::~QDebug(&local_2d8);
        }
        if (this->m_screenConfig->m_separateScreens == false) {
          qLcKmsDebug();
          if (((byte)qLcKmsDebug::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) !=
              0) {
            local_258.screen._0_4_ = 2;
            local_258.screen._4_4_ = 0;
            local_258.vinfo.virtualIndex = 0;
            local_258.vinfo.virtualPos.xp.m_i = 0;
            local_258.vinfo.virtualPos.yp.m_i = 0;
            local_258.vinfo.isPrimary = false;
            local_258.vinfo._13_3_ = 0;
            local_258.vinfo.output.name.d.d = (Data *)qLcKmsDebug::category.name;
            QMessageLogger::debug();
            QVar6 = local_2f0;
            QVar35.m_data = (storage_type *)0x15;
            QVar35.m_size = (qsizetype)&local_158;
            QString::fromUtf8(QVar35);
            QTextStream::operator<<((QTextStream *)QVar6,(QString *)&local_158);
            piVar5 = (int *)CONCAT35(local_158.virtualPos.xp.m_i._1_3_,local_158._0_5_);
            if (piVar5 != (int *)0x0) {
              LOCK();
              *piVar5 = *piVar5 + -1;
              UNLOCK();
              if (*piVar5 == 0) {
                QArrayData::deallocate
                          ((QArrayData *)CONCAT35(local_158.virtualPos.xp.m_i._1_3_,local_158._0_5_)
                           ,2,0x10);
              }
            }
            if ((char)(((QArrayData *)((long)local_2f0 + 0x30))->ref_)._q_value.
                      super___atomic_base<int>._M_i == '\x01') {
              QTextStream::operator<<((QTextStream *)local_2f0,' ');
            }
            local_310 = local_2f0;
            *(int *)((long)local_2f0 + 0x28) = *(int *)((long)local_2f0 + 0x28) + 1;
            ::operator<<((Stream *)local_308,&local_310);
            QDebug::~QDebug((QDebug *)local_308);
            QDebug::~QDebug((QDebug *)&local_310);
            QDebug::~QDebug((QDebug *)&local_2f0);
          }
          local_258.screen._0_4_ = SUB84(pQVar11,0);
          local_258.screen._4_4_ = (undefined4)((ulong)pQVar11 >> 0x20);
          QtPrivate::QPodArrayOps<QPlatformScreen*>::emplace<QPlatformScreen*&>
                    ((QPodArrayOps<QPlatformScreen*> *)&local_288,local_288.d.size,&local_258.screen
                    );
          QList<QPlatformScreen_*>::end(&local_288);
          QtPrivate::QPodArrayOps<QPoint>::emplace<QPoint_const&>
                    ((QPodArrayOps<QPoint> *)&local_2a8,local_2a8.d.size,&local_2c0);
          QList<QPoint>::end(&local_2a8);
          if (((iVar12.i)->vinfo).isPrimary != false) {
            local_320 = (ulong)((int)local_288.d.size - 1);
          }
        }
        else {
          bVar1 = ((iVar12.i)->vinfo).isPrimary;
          local_258.screen._0_4_ = 0;
          local_258.screen._4_4_ = 0;
          local_258.vinfo.virtualIndex = 0;
          local_258.vinfo.virtualPos.xp.m_i = 0;
          local_258.vinfo.virtualPos.yp.m_i = 0;
          local_258.vinfo.isPrimary = false;
          local_258.vinfo._13_3_ = 0;
          local_158._0_5_ = SUB85(pQVar11,0);
          local_158.virtualPos.xp.m_i._1_3_ = (undefined3)((ulong)pQVar11 >> 0x28);
          QtPrivate::QPodArrayOps<QPlatformScreen*>::emplace<QPlatformScreen*&>
                    ((QPodArrayOps<QPlatformScreen*> *)&local_258,0,(QPlatformScreen **)&local_158);
          QList<QPlatformScreen_*>::end((QList<QPlatformScreen_*> *)&local_258);
          (*this->_vptr_QKmsDevice[8])(this,pQVar11,(ulong)bVar1,&local_2c0,&local_258);
          piVar5 = (int *)CONCAT44(local_258.screen._4_4_,local_258.screen._0_4_);
          if (piVar5 != (int *)0x0) {
            LOCK();
            *piVar5 = *piVar5 + -1;
            UNLOCK();
            if (*piVar5 == 0) {
              QArrayData::deallocate
                        ((QArrayData *)CONCAT44(local_258.screen._4_4_,local_258.screen._0_4_),8,
                         0x10);
            }
          }
        }
        iVar12.i = iVar12.i + 1;
      } while (iVar12.i != iVar13.i);
    }
    if ((this->m_screenConfig->m_separateScreens == false) && (local_288.d.size != 0)) {
      lVar14 = 0;
      uVar22 = 0;
      do {
        ppQVar17 = QList<QPlatformScreen_*>::data(&local_288);
        uVar4 = *(undefined8 *)((long)ppQVar17 + lVar14);
        pQVar18 = QList<QPoint>::data(&local_2a8);
        (*this->_vptr_QKmsDevice[8])
                  (this,uVar4,(ulong)(local_320 == uVar22),(long)&(pQVar18->xp).m_i + lVar14,
                   &local_288);
        uVar22 = uVar22 + 1;
        lVar14 = lVar14 + 8;
      } while (uVar22 < (ulong)local_288.d.size);
    }
    if (&(local_2a8.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_2a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_2a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_2a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_2a8.d.d)->super_QArrayData,8,0x10);
      }
    }
    if (&(local_288.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_288.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_288.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_288.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_288.d.d)->super_QArrayData,8,0x10);
      }
    }
    QArrayDataPointer<OrderedScreen>::~QArrayDataPointer(&local_58);
  }
LAB_0013611b:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QKmsDevice::createScreens()
{
    // Headless mode using a render node: cannot do any output related DRM
    // stuff. Skip it all and register a dummy screen.
    if (m_screenConfig->headless()) {
        QPlatformScreen *screen = createHeadlessScreen();
        if (screen) {
            qCDebug(qLcKmsDebug, "Headless mode enabled");
            registerScreen(screen, true, QPoint(0, 0), QList<QPlatformScreen *>());
            return;
        } else {
            qWarning("QKmsDevice: Requested headless mode without support in the backend. Request is ignored.");
        }
    }

    drmSetClientCap(m_dri_fd, DRM_CLIENT_CAP_UNIVERSAL_PLANES, 1);

#if QT_CONFIG(drm_atomic)
    // check atomic support
    m_has_atomic_support = !drmSetClientCap(m_dri_fd, DRM_CLIENT_CAP_ATOMIC, 1);
    if (m_has_atomic_support) {
        qCDebug(qLcKmsDebug, "Atomic reported as supported");
        if (qEnvironmentVariableIntValue("QT_QPA_EGLFS_KMS_ATOMIC")) {
            qCDebug(qLcKmsDebug, "Atomic enabled");
        } else {
            qCDebug(qLcKmsDebug, "Atomic disabled");
            m_has_atomic_support = false;
        }
    }
#endif

    drmModeResPtr resources = drmModeGetResources(m_dri_fd);
    if (!resources) {
        qErrnoWarning(errno, "drmModeGetResources failed");
        return;
    }

    discoverPlanes();

    QList<OrderedScreen> screens;

    int wantedConnectorIndex = -1;
    bool ok;
    int idx = qEnvironmentVariableIntValue("QT_QPA_EGLFS_KMS_CONNECTOR_INDEX", &ok);
    if (ok) {
        if (idx >= 0 && idx < resources->count_connectors)
            wantedConnectorIndex = idx;
        else
            qWarning("Invalid connector index %d, must be between 0 and %u", idx, resources->count_connectors - 1);
    }

    for (int i = 0; i < resources->count_connectors; i++) {
        if (wantedConnectorIndex >= 0 && i != wantedConnectorIndex)
            continue;

        drmModeConnectorPtr connector = drmModeGetConnector(m_dri_fd, resources->connectors[i]);
        if (!connector)
            continue;

        ScreenInfo vinfo;
        QPlatformScreen *screen = createScreenForConnector(resources, connector, &vinfo);
        if (screen)
            screens.append(OrderedScreen(screen, vinfo));

        drmModeFreeConnector(connector);
    }

    drmModeFreeResources(resources);

    // Use stable sort to preserve the original (DRM connector) order
    // for outputs with unspecified indices.
    std::stable_sort(screens.begin(), screens.end(), orderedScreenLessThan);
    qCDebug(qLcKmsDebug) << "Sorted screen list:" << screens;

    // The final list of screens is available, so do the second phase setup.
    // Hook up clone sources and targets.
    for (const OrderedScreen &orderedScreen : screens) {
        QList<QPlatformScreen *> screensCloningThisScreen;
        for (const OrderedScreen &s : screens) {
            if (s.vinfo.output.clone_source == orderedScreen.vinfo.output.name)
                screensCloningThisScreen.append(s.screen);
        }
        QPlatformScreen *screenThisScreenClones = nullptr;
        if (!orderedScreen.vinfo.output.clone_source.isEmpty()) {
            for (const OrderedScreen &s : screens) {
                if (s.vinfo.output.name == orderedScreen.vinfo.output.clone_source) {
                    screenThisScreenClones = s.screen;
                    break;
                }
            }
        }
        if (screenThisScreenClones)
            qCDebug(qLcKmsDebug) << orderedScreen.screen->name() << "clones" << screenThisScreenClones;
        if (!screensCloningThisScreen.isEmpty())
            qCDebug(qLcKmsDebug) << orderedScreen.screen->name() << "is cloned by" << screensCloningThisScreen;

        registerScreenCloning(orderedScreen.screen, screenThisScreenClones, screensCloningThisScreen);
    }

    // Figure out the virtual desktop and register the screens to QPA/QGuiApplication.
    QPoint pos(0, 0);
    QList<QPlatformScreen *> siblings;
    QList<QPoint> virtualPositions;
    int primarySiblingIdx = -1;

    for (const OrderedScreen &orderedScreen : screens) {
        QPlatformScreen *s = orderedScreen.screen;
        QPoint virtualPos(0, 0);
        // set up a horizontal or vertical virtual desktop
        if (orderedScreen.vinfo.virtualPos.isNull()) {
            virtualPos = pos;
            if (m_screenConfig->virtualDesktopLayout() == QKmsScreenConfig::VirtualDesktopLayoutVertical)
                pos.ry() += s->geometry().height();
            else
                pos.rx() += s->geometry().width();
        } else {
            virtualPos = orderedScreen.vinfo.virtualPos;
        }
        qCDebug(qLcKmsDebug) << "Adding QPlatformScreen" << s << "(" << s->name() << ")"
                             << "to QPA with geometry" << s->geometry()
                             << "and isPrimary=" << orderedScreen.vinfo.isPrimary;
        // The order in qguiapp's screens list will match the order set by
        // virtualIndex. This is not only handy but also required since for instance
        // evdevtouch relies on it when performing touch device - screen mapping.
        if (!m_screenConfig->separateScreens()) {
            qCDebug(qLcKmsDebug) << "  virtual position is" << virtualPos;
            siblings.append(s);
            virtualPositions.append(virtualPos);
            if (orderedScreen.vinfo.isPrimary)
                primarySiblingIdx = siblings.size() - 1;
        } else {
            registerScreen(s, orderedScreen.vinfo.isPrimary, virtualPos, QList<QPlatformScreen *>() << s);
        }
    }

    if (!m_screenConfig->separateScreens()) {
        // enable the virtual desktop
        for (int i = 0; i < siblings.size(); ++i)
            registerScreen(siblings[i], i == primarySiblingIdx, virtualPositions[i], siblings);
    }
}